

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlParseDocument(htmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr in;
  setDocumentLocatorSAXFunc p_Var1;
  void *pvVar2;
  xmlChar *pxVar3;
  startDocumentSAXFunc p_Var4;
  __int32_t *p_Var5;
  endDocumentSAXFunc p_Var6;
  xmlCharEncoding enc;
  undefined8 in_RAX;
  xmlSAXLocator *pxVar7;
  __int32_t **pp_Var8;
  xmlDtdPtr pxVar9;
  xmlChar xVar10;
  int iVar11;
  bool bVar12;
  xmlChar start [4];
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xmlInitParser();
  htmlDefaultSAXHandlerInit();
  if ((ctxt == (htmlParserCtxtPtr)0x0) || (in = ctxt->input, in == (xmlParserInputPtr)0x0)) {
    iVar11 = 1;
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"htmlParseDocument: context error\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  else {
    ctxt->html = 1;
    ctxt->linenumbers = 1;
    if ((ctxt->progressive == 0) && ((long)in->end - (long)in->cur < 0xfa)) {
      xmlParserInputGrow(in,0xfa);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var1 = ctxt->sax->setDocumentLocator, p_Var1 != (setDocumentLocatorSAXFunc)0x0)) {
      pvVar2 = ctxt->userData;
      pxVar7 = __xmlDefaultSAXLocator();
      (*p_Var1)(pvVar2,pxVar7);
    }
    if ((ctxt->encoding == (xmlChar *)0x0) &&
       (pxVar3 = ctxt->input->cur, 3 < (long)ctxt->input->end - (long)pxVar3)) {
      xVar10 = 0xff;
      if (ctxt->token == 0) {
        xVar10 = *pxVar3;
      }
      uStack_28 = CONCAT17(pxVar3[3],
                           CONCAT16(pxVar3[2],
                                    CONCAT15(pxVar3[1],CONCAT14(xVar10,(undefined4)uStack_28))));
      enc = xmlDetectCharEncoding((uchar *)((long)&uStack_28 + 4),4);
      if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt,enc);
      }
    }
    htmlSkipBlankChars(ctxt);
    if (*ctxt->input->cur == '\0') {
      htmlParseErr(ctxt,XML_ERR_DOCUMENT_EMPTY,"Document is empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var4 = ctxt->sax->startDocument, p_Var4 != (startDocumentSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var4)(ctxt->userData);
    }
    while( true ) {
      pxVar3 = ctxt->input->cur;
      bVar12 = *pxVar3 != '<';
      if (bVar12) break;
      if (((pxVar3[1] != '!') || (pxVar3[2] != '-')) || (pxVar3[3] != '-')) {
        if (bVar12) break;
        if (pxVar3[1] != '?') {
          if ((!bVar12) && (pxVar3[1] == '!')) {
            pp_Var8 = __ctype_toupper_loc();
            p_Var5 = *pp_Var8;
            if (((p_Var5[pxVar3[2]] == 0x44) &&
                ((((p_Var5[pxVar3[3]] == 0x4f && (p_Var5[pxVar3[4]] == 0x43)) &&
                  (p_Var5[pxVar3[5]] == 0x54)) &&
                 ((p_Var5[pxVar3[6]] == 0x59 && (p_Var5[pxVar3[7]] == 0x50)))))) &&
               (p_Var5[pxVar3[8]] == 0x45)) {
              htmlParseDocTypeDecl(ctxt);
            }
          }
          break;
        }
      }
      htmlParseComment(ctxt);
      htmlParsePI(ctxt);
      htmlSkipBlankChars(ctxt);
    }
    while( true ) {
      htmlSkipBlankChars(ctxt);
      pxVar3 = ctxt->input->cur;
      if ((*pxVar3 != '<') ||
         ((((pxVar3[1] != '!' || (pxVar3[2] != '-')) || (pxVar3[3] != '-')) &&
          ((*pxVar3 != '<' || (pxVar3[1] != '?')))))) break;
      htmlParseComment(ctxt);
      htmlParsePI(ctxt);
    }
    htmlParseContentInternal(ctxt);
    if (*ctxt->input->cur == '\0') {
      htmlAutoCloseOnEnd(ctxt);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var6 = ctxt->sax->endDocument, p_Var6 != (endDocumentSAXFunc)0x0)) {
      (*p_Var6)(ctxt->userData);
    }
    if (((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) {
      pxVar9 = xmlGetIntSubset(ctxt->myDoc);
      if (pxVar9 == (xmlDtdPtr)0x0) {
        pxVar9 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                    (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                    (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
        ctxt->myDoc->intSubset = pxVar9;
      }
    }
    iVar11 = -(uint)(ctxt->wellFormed == 0);
  }
  return iVar11;
}

Assistant:

int
htmlParseDocument(htmlParserCtxtPtr ctxt) {
    xmlChar start[4];
    xmlCharEncoding enc;
    xmlDtdPtr dtd;

    xmlInitParser();

    htmlDefaultSAXHandlerInit();

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseDocument: context error\n", NULL, NULL);
	return(XML_ERR_INTERNAL_ERROR);
    }
    ctxt->html = 1;
    ctxt->linenumbers = 1;
    GROW;
    /*
     * SAX: beginning of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator))
        ctxt->sax->setDocumentLocator(ctxt->userData, &xmlDefaultSAXLocator);

    if ((ctxt->encoding == (const xmlChar *)XML_CHAR_ENCODING_NONE) &&
        ((ctxt->input->end - ctxt->input->cur) >= 4)) {
	/*
	 * Get the 4 first bytes and decode the charset
	 * if enc != XML_CHAR_ENCODING_NONE
	 * plug some encoding conversion routines.
	 */
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(&start[0], 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }

    /*
     * Wipe out everything which is before the first '<'
     */
    SKIP_BLANKS;
    if (CUR == 0) {
	htmlParseErr(ctxt, XML_ERR_DOCUMENT_EMPTY,
	             "Document is empty\n", NULL, NULL);
    }

    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
	ctxt->sax->startDocument(ctxt->userData);


    /*
     * Parse possible comments and PIs before any content
     */
    while (((CUR == '<') && (NXT(1) == '!') &&
            (NXT(2) == '-') && (NXT(3) == '-')) ||
	   ((CUR == '<') && (NXT(1) == '?'))) {
        htmlParseComment(ctxt);
        htmlParsePI(ctxt);
	SKIP_BLANKS;
    }


    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    if ((CUR == '<') && (NXT(1) == '!') &&
	(UPP(2) == 'D') && (UPP(3) == 'O') &&
	(UPP(4) == 'C') && (UPP(5) == 'T') &&
	(UPP(6) == 'Y') && (UPP(7) == 'P') &&
	(UPP(8) == 'E')) {
	htmlParseDocTypeDecl(ctxt);
    }
    SKIP_BLANKS;

    /*
     * Parse possible comments and PIs before any content
     */
    while (((CUR == '<') && (NXT(1) == '!') &&
            (NXT(2) == '-') && (NXT(3) == '-')) ||
	   ((CUR == '<') && (NXT(1) == '?'))) {
        htmlParseComment(ctxt);
        htmlParsePI(ctxt);
	SKIP_BLANKS;
    }

    /*
     * Time to start parsing the tree itself
     */
    htmlParseContentInternal(ctxt);

    /*
     * autoclose
     */
    if (CUR == 0)
	htmlAutoCloseOnEnd(ctxt);


    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) && (ctxt->myDoc != NULL)) {
	dtd = xmlGetIntSubset(ctxt->myDoc);
	if (dtd == NULL)
	    ctxt->myDoc->intSubset =
		xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
		    BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
		    BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
    }
    if (! ctxt->wellFormed) return(-1);
    return(0);
}